

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O0

void __thiscall AsyncRgbLedAnalyzer::WorkerThread(AsyncRgbLedAnalyzer *this)

{
  bool bVar1;
  uint uVar2;
  AnalyzerChannelData *pAVar3;
  pointer pAVar4;
  double *pdVar5;
  pointer pAVar6;
  FrameV2 local_138 [8];
  FrameV2 frame_v2;
  ulonglong local_120;
  Frame frame;
  undefined1 local_f8 [8];
  RGBResult result;
  U32 frameInPacketIndex;
  bool isResyncNeeded;
  double adStack_b8 [3];
  BitTiming local_a0;
  BitTiming local_70;
  BitTiming local_40;
  AsyncRgbLedAnalyzer *local_10;
  AsyncRgbLedAnalyzer *this_local;
  
  local_10 = this;
  uVar2 = Analyzer::GetSampleRate();
  this->mSampleRateHz = (double)uVar2;
  std::unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>::
  operator->(&this->mSettings);
  pAVar3 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mChannelData = pAVar3;
  pAVar4 = std::
           unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
           ::operator->(&this->mSettings);
  bVar1 = AsyncRgbLedAnalyzerSettings::IsHighSpeedSupported(pAVar4);
  if (bVar1) {
    pAVar4 = std::
             unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ::operator->(&this->mSettings);
    AsyncRgbLedAnalyzerSettings::DataTiming(&local_40,pAVar4,BIT_LOW,true);
    pAVar4 = std::
             unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ::operator->(&this->mSettings);
    AsyncRgbLedAnalyzerSettings::DataTiming(&local_70,pAVar4,BIT_HIGH,true);
    pdVar5 = std::min<double>(&local_40.mNegativeTiming.mMinimumSec,
                              &local_70.mNegativeTiming.mMinimumSec);
    this->mMinimumLowDurationSec = *pdVar5;
  }
  else {
    pAVar4 = std::
             unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ::operator->(&this->mSettings);
    AsyncRgbLedAnalyzerSettings::DataTiming(&local_a0,pAVar4,BIT_LOW,false);
    pAVar4 = std::
             unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ::operator->(&this->mSettings);
    AsyncRgbLedAnalyzerSettings::DataTiming((BitTiming *)&frameInPacketIndex,pAVar4,BIT_HIGH,false);
    pdVar5 = std::min<double>(&local_a0.mNegativeTiming.mMinimumSec,adStack_b8);
    this->mMinimumLowDurationSec = *pdVar5;
  }
  result.mValueEndSample._7_1_ = 1;
  do {
    if ((result.mValueEndSample._7_1_ & 1) != 0) {
      SynchronizeToReset(this);
      result.mValueEndSample._7_1_ = 0;
    }
    this->mFirstBitAfterReset = true;
    result.mValueEndSample._0_4_ = 0;
    std::unique_ptr<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>::
    operator->(&this->mResults);
    AnalyzerResults::CommitPacketAndStartNewPacket();
    do {
      ReadRGBTriple((RGBResult *)local_f8,this);
      if ((local_f8[0] & 1U) == 0) {
        result.mValueEndSample._7_1_ = 1;
      }
      else {
        Frame::Frame((Frame *)&local_120);
        local_120 = result._8_8_;
        _frame = result.mValueBeginSample;
        RGBValue::ConvertToU64((RGBValue *)(local_f8 + 2));
        result.mValueEndSample._0_4_ = (int)result.mValueEndSample + 1;
        pAVar6 = std::
                 unique_ptr<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
                 ::operator->(&this->mResults);
        AnalyzerResults::AddFrame((Frame *)pAVar6);
        FrameV2::FrameV2(local_138);
        FrameV2::AddInteger((char *)local_138,0x116028);
        FrameV2::AddInteger((char *)local_138,0x11602e);
        FrameV2::AddInteger((char *)local_138,0x116032);
        FrameV2::AddInteger((char *)local_138,0x116038);
        pAVar6 = std::
                 unique_ptr<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
                 ::operator->(&this->mResults);
        AnalyzerResults::AddFrameV2((FrameV2 *)pAVar6,(char *)local_138,0x11603d,local_120);
        std::
        unique_ptr<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>::
        operator->(&this->mResults);
        AnalyzerResults::CommitResults();
        FrameV2::~FrameV2(local_138);
        Frame::~Frame((Frame *)&local_120);
      }
    } while (((result.mValueEndSample._7_1_ & 1) == 0) && ((local_f8[1] & 1U) == 0));
    std::unique_ptr<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>::
    operator->(&this->mResults);
    AnalyzerResults::CommitResults();
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
  } while( true );
}

Assistant:

void AsyncRgbLedAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();
    mChannelData = GetAnalyzerChannelData( mSettings->mInputChannel );

    // cache this value here to avoid recomputing this every bit-read
    if( mSettings->IsHighSpeedSupported() )
    {
        mMinimumLowDurationSec = std::min( mSettings->DataTiming( BIT_LOW, true ).mNegativeTiming.mMinimumSec,
                                           mSettings->DataTiming( BIT_HIGH, true ).mNegativeTiming.mMinimumSec );
    }
    else
    {
        mMinimumLowDurationSec = std::min( mSettings->DataTiming( BIT_LOW ).mNegativeTiming.mMinimumSec,
                                           mSettings->DataTiming( BIT_HIGH ).mNegativeTiming.mMinimumSec );
    }

    bool isResyncNeeded = true;

    for( ;; )
    {
        if( isResyncNeeded )
        {
            SynchronizeToReset();
            isResyncNeeded = false;
        }

        mFirstBitAfterReset = true;
        U32 frameInPacketIndex = 0;
        mResults->CommitPacketAndStartNewPacket();

        // data word reading loop
        for( ;; )
        {
            auto result = ReadRGBTriple();

            if( result.mValid )
            {
                Frame frame;
                frame.mFlags = 0;
                frame.mStartingSampleInclusive = result.mValueBeginSample;
                frame.mEndingSampleInclusive = result.mValueEndSample;
                frame.mData1 = result.mRGB.ConvertToU64();
                frame.mData2 = frameInPacketIndex++;
                mResults->AddFrame( frame );

                FrameV2 frame_v2;
                frame_v2.AddInteger( "index", frame.mData2 );
                frame_v2.AddInteger( "red", result.mRGB.red );
                frame_v2.AddInteger( "green", result.mRGB.green );
                frame_v2.AddInteger( "blue", result.mRGB.blue );
                mResults->AddFrameV2( frame_v2, "pixel", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );

                mResults->CommitResults();
            }
            else
            {
                // something error occurred, let's resynchronise
                isResyncNeeded = true;
            }

            if( isResyncNeeded || result.mIsReset )
            {
                break;
            }
        }

        mResults->CommitResults();
        ReportProgress( mChannelData->GetSampleNumber() );
    }
}